

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

Var mapVar(Var x,vec<int,_int> *map,Var *max)

{
  int iVar1;
  Size SVar2;
  int *piVar3;
  int local_24;
  int *local_20;
  Var *max_local;
  vec<int,_int> *map_local;
  Var x_local;
  
  local_20 = max;
  max_local = (Var *)map;
  map_local._4_4_ = x;
  SVar2 = Minisat::vec<int,_int>::size(map);
  if (map_local._4_4_ < SVar2) {
    piVar3 = Minisat::vec<int,_int>::operator[]((vec<int,_int> *)max_local,map_local._4_4_);
    if (*piVar3 != -1) goto LAB_00114beb;
  }
  local_24 = -1;
  Minisat::vec<int,_int>::growTo((vec<int,_int> *)max_local,map_local._4_4_ + 1,&local_24);
  iVar1 = *local_20;
  *local_20 = iVar1 + 1;
  piVar3 = Minisat::vec<int,_int>::operator[]((vec<int,_int> *)max_local,map_local._4_4_);
  *piVar3 = iVar1;
LAB_00114beb:
  piVar3 = Minisat::vec<int,_int>::operator[]((vec<int,_int> *)max_local,map_local._4_4_);
  return *piVar3;
}

Assistant:

static Var mapVar(Var x, vec<Var>& map, Var& max)
{
    if (map.size() <= x || map[x] == -1){
        map.growTo(x+1, -1);
        map[x] = max++;
    }
    return map[x];
}